

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O0

Wln_Ntk_t * Wln_ReadNdr(char *pFileName)

{
  void *pData_00;
  undefined8 local_30;
  Wln_Ntk_t *pNtk;
  void *pData;
  char *pFileName_local;
  
  pData_00 = Ndr_Read(pFileName);
  if (pData_00 == (void *)0x0) {
    local_30 = (Wln_Ntk_t *)0x0;
  }
  else {
    local_30 = Wln_NtkFromNdr(pData_00);
  }
  if (local_30 == (Wln_Ntk_t *)0x0) {
    Ndr_Delete(pData_00);
    pFileName_local = (char *)local_30;
  }
  else {
    pFileName_local = (char *)0x0;
  }
  return (Wln_Ntk_t *)pFileName_local;
}

Assistant:

Wln_Ntk_t * Wln_ReadNdr( char * pFileName )
{
    void * pData = Ndr_Read( pFileName );
    Wln_Ntk_t * pNtk = pData ? Wln_NtkFromNdr( pData ) : NULL;
    if ( pNtk ) return NULL;
    //char * ppNames[10] = { NULL, "a", "b", "c", "d", "e", "f", "g", "h", "i" };
    //Ndr_WriteVerilog( NULL, pData, ppNames );
    Ndr_Delete( pData );
    return pNtk;
}